

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O1

void __thiscall CMU462::PathTracer::save_image(PathTracer *this,string *fname)

{
  if (this->state != DONE) {
    return;
  }
  save_image();
  return;
}

Assistant:

void PathTracer::save_image(string fname) {

    if (state != DONE) return;

    uint32_t* frame = &frameBuffer.data[0];
    size_t w = frameBuffer.w;
    size_t h = frameBuffer.h;
    uint32_t* frame_out = new uint32_t[w * h];
    for(size_t i = 0; i < h; ++i) {
      memcpy(frame_out + i * w, frame + (h - i - 1) * w, 4 * w);
    }

    fprintf(stderr, "[PathTracer] Saving to file: %s... ", fname.c_str());
    lodepng::encode(fname, (unsigned char*) frame_out, w, h);
    fprintf(stderr, "Done!\n");
  }